

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenModuleRef BinaryenModuleParse(char *text)

{
  Module *this;
  Fatal *this_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_R9;
  string_view in;
  Fatal local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  Err *err;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [8];
  Result<wasm::Ok> parsed;
  Module *wasm;
  char *text_local;
  
  this = (Module *)operator_new(0x3f0);
  ::wasm::Module::Module(this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,text);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  in._M_str = (char *)&local_88;
  in._M_len = (size_t)local_60._M_str;
  ::wasm::WATParser::parseModule
            ((Result<wasm::Ok> *)local_50,(WATParser *)this,(Module *)local_60._M_len,in,in_R9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_88);
  local_98 = &::wasm::Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_50)->msg;
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::wasm::Fatal::Fatal(&local_220);
    this_00 = ::wasm::Fatal::operator<<(&local_220,local_98);
    ::wasm::Fatal::operator<<(this_00,(char (*) [2])0x294c86f);
    ::wasm::Fatal::~Fatal(&local_220);
  }
  ::wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_50);
  return this;
}

Assistant:

BinaryenModuleRef BinaryenModuleParse(const char* text) {
  auto* wasm = new Module;
  auto parsed = WATParser::parseModule(*wasm, text);
  if (auto* err = parsed.getErr()) {
    Fatal() << err->msg << "\n";
  }
  return wasm;
}